

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

Qiniu_Error
Qiniu_Io_call(Qiniu_Client *self,char *accessKey,char *bucketName,Qiniu_Io_PutRet *ret,
             curl_httppost *formpost,Qiniu_Io_PutExtra *extra)

{
  uint code;
  Qiniu_Retry_Decision QVar1;
  undefined8 uVar2;
  CURL *curl_00;
  char *pcVar3;
  undefined8 extraout_RDX;
  Qiniu_Error QVar4;
  CURL *curl;
  size_t retries;
  size_t local_70;
  size_t upHostsCount;
  char *defaultUpHosts [1];
  char **upHosts;
  curl_slist *headers;
  int retCode;
  Qiniu_Io_PutExtra *extra_local;
  curl_httppost *formpost_local;
  Qiniu_Io_PutRet *ret_local;
  char *bucketName_local;
  char *accessKey_local;
  Qiniu_Client *self_local;
  Qiniu_Error err;
  
  upHostsCount = (size_t)QINIU_UP_HOST;
  uVar2 = curl_slist_append(0,"Expect:");
  QVar4 = _Qiniu_Get_UpHosts(self,accessKey,bucketName,extra,(char ***)defaultUpHosts,&local_70);
  err._0_8_ = QVar4.message;
  self_local = (Qiniu_Client *)(ulong)(uint)QVar4.code;
  if (QVar4.code == 200) {
    if (local_70 == 0) {
      defaultUpHosts[0] = (char *)&upHostsCount;
      local_70 = 1;
    }
    for (curl = (CURL *)0x0; curl <= (CURL *)self->hostsRetriesMax; curl = (CURL *)((long)curl + 1))
    {
      curl_00 = Qiniu_Client_reset(self);
      QVar4 = Qiniu_Client_config(self);
      err._0_8_ = QVar4.message;
      self_local = (Qiniu_Client *)(ulong)(uint)QVar4.code;
      if (QVar4.code != 200) goto LAB_001185fc;
      curl_easy_setopt(curl_00,0x2712,
                       *(undefined8 *)(defaultUpHosts[0] + ((ulong)curl % local_70) * 8));
      curl_easy_setopt(curl_00,0x2728,formpost);
      curl_easy_setopt(curl_00,0x2727,uVar2);
      if (extra->uploadingProgress == (_func_void_size_t_size_t *)0x0) {
        curl_easy_setopt(curl_00,0x2b,1);
      }
      else {
        curl_easy_setopt(curl_00,0x4e58,_Qiniu_Progress_Callback);
        curl_easy_setopt(curl_00,0x2749,extra->uploadingProgress);
        curl_easy_setopt(curl_00,0x2b,0);
      }
      if (extra->upAbortCallback != (Qiniu_Rd_FnAbort)0x0) {
        curl_easy_setopt(curl_00,0x4e2c,Qiniu_Rd_Reader_Callback);
      }
      QVar4 = Qiniu_callex(curl_00,&self->b,&self->root,0,&self->respHeader);
      err._0_8_ = QVar4.message;
      code = QVar4.code;
      self_local = (Qiniu_Client *)(ulong)code;
      if (code == 200) {
        if (extra->callbackRetParser == (_func_Qiniu_Error_void_ptr_Qiniu_Json_ptr *)0x0) {
          if (ret != (Qiniu_Io_PutRet *)0x0) {
            pcVar3 = Qiniu_Json_GetString(self->root,"hash",(char *)0x0);
            ret->hash = pcVar3;
            pcVar3 = Qiniu_Json_GetString(self->root,"key",(char *)0x0);
            ret->key = pcVar3;
            pcVar3 = Qiniu_Json_GetString(self->root,"persistentId",(char *)0x0);
            ret->persistentId = pcVar3;
          }
        }
        else {
          QVar4 = (*extra->callbackRetParser)(extra->callbackRet,self->root);
          self_local = (Qiniu_Client *)(ulong)(uint)QVar4;
          err._0_8_ = extraout_RDX;
        }
        break;
      }
      QVar1 = _Qiniu_Should_Retry(code);
      if (QVar1 == QINIU_DONT_RETRY) break;
    }
    curl_formfree(formpost);
    curl_slist_free_all(uVar2);
  }
LAB_001185fc:
  QVar4.message = (char *)err._0_8_;
  QVar4._0_8_ = self_local;
  return QVar4;
}

Assistant:

static Qiniu_Error Qiniu_Io_call(
    Qiniu_Client *self, const char *accessKey, const char *bucketName,
    Qiniu_Io_PutRet *ret, struct curl_httppost *formpost, Qiniu_Io_PutExtra *extra)
{
    int retCode = 0;
    Qiniu_Error err;
    struct curl_slist *headers;
    const char *const *upHosts;
    const char *defaultUpHosts[] = {QINIU_UP_HOST};
    size_t upHostsCount;

    headers = curl_slist_append(NULL, "Expect:");
    err = _Qiniu_Get_UpHosts(self, accessKey, bucketName, extra, &upHosts, &upHostsCount);
    if (err.code != 200)
    {
        return err;
    }
    if (upHostsCount == 0)
    {
        upHosts = defaultUpHosts;
        upHostsCount = 1;
    }

    for (size_t retries = 0; retries <= self->hostsRetriesMax; retries++)
    {
        CURL *curl = Qiniu_Client_reset(self);
        err = Qiniu_Client_config(self);
        if (err.code != 200)
        {
            return err;
        }

        curl_easy_setopt(curl, CURLOPT_URL, upHosts[retries % upHostsCount]);
        curl_easy_setopt(curl, CURLOPT_HTTPPOST, formpost);
        curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);
        if (extra->uploadingProgress != NULL)
        {
            curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION, _Qiniu_Progress_Callback);
            curl_easy_setopt(curl, CURLOPT_PROGRESSDATA, extra->uploadingProgress);
            curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
        }
        else
        {
            curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 1);
        }

        //// For aborting uploading file.
        if (extra->upAbortCallback)
        {
            curl_easy_setopt(curl, CURLOPT_READFUNCTION, Qiniu_Rd_Reader_Callback);
        } // if

        err = Qiniu_callex(curl, &self->b, &self->root, Qiniu_False, &self->respHeader);
        if (err.code == 200)
        {
            if (extra->callbackRetParser != NULL)
            {
                err = (*extra->callbackRetParser)(extra->callbackRet, self->root);
            }
            else if (ret != NULL)
            {
                ret->hash = Qiniu_Json_GetString(self->root, "hash", NULL);
                ret->key = Qiniu_Json_GetString(self->root, "key", NULL);
                ret->persistentId = Qiniu_Json_GetString(self->root, "persistentId", NULL);
            }
            break;
        }
        else if (_Qiniu_Should_Retry(err.code) == QINIU_DONT_RETRY)
        {
            break;
        }
    }
    curl_formfree(formpost);
    curl_slist_free_all(headers);
    return err;
}